

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstyleditemdelegate.cpp
# Opt level: O0

void __thiscall
QStyledItemDelegate::updateEditorGeometry
          (QStyledItemDelegate *this,QWidget *editor,QStyleOptionViewItem *option,QModelIndex *index
          )

{
  int iVar1;
  QWidget *pQVar2;
  QStyle *pQVar3;
  undefined8 in_RCX;
  QStyleOptionViewItem *in_RDX;
  long in_RSI;
  QStyleOptionViewItem *in_RDI;
  long in_FS_OFFSET;
  QStyle *style;
  QWidget *widget;
  QRect geom;
  QStyleOptionViewItem opt;
  QStyleOptionViewItem *in_stack_fffffffffffffed8;
  QStyleOptionViewItem *r;
  undefined1 local_d8 [104];
  undefined1 local_70;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RSI != 0) {
    r = in_RDI;
    pQVar2 = QStyledItemDelegatePrivate::widget(in_RDX);
    memset(local_d8,0xaa,0xd0);
    QStyleOptionViewItem::QStyleOptionViewItem(in_RDI,in_stack_fffffffffffffed8);
    (**(code **)(*(long *)&in_RDI->super_QStyleOption + 0xb8))(in_RDI,local_d8,in_RCX);
    pQVar3 = QWidget::style((QWidget *)in_stack_fffffffffffffed8);
    iVar1 = (**(code **)(*(long *)pQVar3 + 0xf0))(pQVar3,0x3c,0,in_RSI);
    local_70 = iVar1 != 0;
    if (pQVar2 == (QWidget *)0x0) {
      pQVar3 = QApplication::style();
    }
    else {
      pQVar3 = QWidget::style((QWidget *)in_stack_fffffffffffffed8);
    }
    pQVar2 = (QWidget *)(**(code **)(*(long *)pQVar3 + 0xc0))(pQVar3,0x2e,local_d8,pQVar2);
    QWidget::setGeometry(pQVar2,(QRect *)r);
    QStyleOptionViewItem::~QStyleOptionViewItem(in_RDI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QStyledItemDelegate::updateEditorGeometry(QWidget *editor,
                                         const QStyleOptionViewItem &option,
                                         const QModelIndex &index) const
{
    if (!editor)
        return;
    Q_ASSERT(index.isValid());
    const QWidget *widget = QStyledItemDelegatePrivate::widget(option);

    QStyleOptionViewItem opt = option;
    initStyleOption(&opt, index);
    opt.showDecorationSelected = editor->style()->styleHint(QStyle::SH_ItemView_ShowDecorationSelected, nullptr, editor);

    QStyle *style = widget ? widget->style() : QApplication::style();
    QRect geom = style->subElementRect(QStyle::SE_ItemViewItemText, &opt, widget);
    editor->setGeometry(geom);
}